

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.cpp
# Opt level: O2

void __thiscall Liby::Poller::runNextLoopHandlers(Poller *this)

{
  list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *this_00;
  iterator __begin1;
  _List_node_base *p_Var1;
  
  p_Var1 = (this->nextLoopHandlers_).
           super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  this_00 = &this->nextLoopHandlers_;
  if (p_Var1 != (_List_node_base *)this_00) {
    for (; p_Var1 != (_List_node_base *)this_00; p_Var1 = p_Var1->_M_next) {
      std::function<void_()>::operator()((function<void_()> *)(p_Var1 + 1));
    }
    std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::clear
              (this_00);
    return;
  }
  return;
}

Assistant:

void Poller::runNextLoopHandlers() {
    if (nextLoopHandlers_.empty())
        return;
    for (auto &handler : nextLoopHandlers_)
        handler();
    nextLoopHandlers_.clear();
}